

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O2

void fixVarTree(MtrNode *treenode,int *perm,int size)

{
  uint uVar1;
  
  do {
    uVar1 = treenode->low;
    treenode->index = uVar1;
    if ((int)uVar1 < size) {
      uVar1 = perm[uVar1];
    }
    treenode->low = uVar1;
    if (treenode->child != (MtrNode *)0x0) {
      fixVarTree(treenode->child,perm,size);
    }
    treenode = treenode->younger;
  } while (treenode != (MtrNode *)0x0);
  return;
}

Assistant:

static void
fixVarTree(
  MtrNode * treenode,
  int * perm,
  int  size)
{
    treenode->index = treenode->low;
    treenode->low = ((int) treenode->index < size) ?
        perm[treenode->index] : treenode->index;
    if (treenode->child != NULL)
        fixVarTree(treenode->child, perm, size);
    if (treenode->younger != NULL)
        fixVarTree(treenode->younger, perm, size);
    return;

}